

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<ProString>::reserve(QList<ProString> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  qsizetype qVar4;
  ProString *pPVar5;
  ProString *pPVar6;
  ProString *data;
  ProString *other;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<ProString> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 4) * 0x5555555555555555 + (pDVar2->super_QArrayData).alloc)) {
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_0010bca4;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_0010bca4;
    }
  }
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  lVar3 = (this->d).size;
  if (asize < lVar3) {
    asize = lVar3;
  }
  local_30 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  pPVar5 = (ProString *)QArrayData::allocate(&local_30,0x30,0x10,asize,KeepSize);
  local_48.d = (Data *)local_30;
  local_48.size = 0;
  lVar3 = (this->d).size;
  local_48.ptr = pPVar5;
  if (0 < lVar3) {
    other = (this->d).ptr;
    pPVar6 = other + lVar3;
    do {
      ProString::ProString(pPVar5 + local_48.size,other);
      other = other + 1;
      local_48.size = local_48.size + 1;
    } while (other < pPVar6);
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    *(byte *)&(((ArrayOptions *)((long)local_48.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_48.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar2 = (this->d).d;
  pPVar5 = (this->d).ptr;
  (this->d).d = local_48.d;
  (this->d).ptr = local_48.ptr;
  qVar4 = (this->d).size;
  (this->d).size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = pPVar5;
  local_48.size = qVar4;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_48);
LAB_0010bca4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}